

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::serialize<double>
          (options_serializer_boost_po *this,typed_option<double> *typed_option)

{
  element_type *peVar1;
  ostream *poVar2;
  element_type eVar3;
  
  poVar2 = std::operator<<((ostream *)&this->field_0x18," --");
  poVar2 = std::operator<<(poVar2,(string *)&(typed_option->super_base_option).m_name);
  std::operator<<(poVar2," ");
  peVar1 = (typed_option->m_value).super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    eVar3 = 0.0;
  }
  else {
    eVar3 = *peVar1;
  }
  std::ostream::_M_insert<double>(eVar3);
  return;
}

Assistant:

void serialize(typed_option<T>& typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }